

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall Qentem::QTest::afterTest(QTest *this,bool test_for_leaks)

{
  int iVar1;
  SizeT remaining_allocations;
  uint local_2c;
  char *local_28;
  char *local_20;
  
  if (this->error_ == false) {
    local_20 = TestOutPut::GetColor(PASS);
    local_28 = TestOutPut::GetColor(END);
    local_2c = CONCAT31(local_2c._1_3_,10);
    TestOutPut::Print<char_const*,char[5],char_const*,char[3],char_const*,char>
              (&local_20,(char (*) [5])"Pass",&local_28,(char (*) [3])0x117086,&this->part_name_,
               (char *)&local_2c);
  }
  if (test_for_leaks) {
    if (MemoryRecord::CheckSubMemory()::storage == '\0') {
      iVar1 = __cxa_guard_acquire(&MemoryRecord::CheckSubMemory()::storage);
      if (iVar1 != 0) {
        MemoryRecord::CheckSubMemory()::storage = MemoryRecord::getStorage()::data;
        __cxa_guard_release(&MemoryRecord::CheckSubMemory()::storage);
      }
    }
    local_2c = *(int *)(MemoryRecord::CheckSubMemory()::storage + 8) -
               *(int *)(MemoryRecord::CheckSubMemory()::storage + 0xc);
    if (MemoryRecord::ResetSubMemory()::storage == '\0') {
      iVar1 = __cxa_guard_acquire(&MemoryRecord::ResetSubMemory()::storage);
      if (iVar1 != 0) {
        MemoryRecord::ResetSubMemory()::storage = MemoryRecord::getStorage()::data;
        __cxa_guard_release(&MemoryRecord::ResetSubMemory()::storage);
      }
    }
    *(undefined8 *)(MemoryRecord::ResetSubMemory()::storage + 8) = 0;
    if (local_2c != 0) {
      local_20 = TestOutPut::GetColor(ERROR);
      local_28 = TestOutPut::GetColor(END);
      TestOutPut::Print<char_const*,char[14],char_const*,char[3],unsigned_int,char[25]>
                (&local_20,(char (*) [14])"Leak detected",&local_28,(char (*) [3])0x117086,&local_2c
                 ,(char (*) [25])" remaining allocations.\n");
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void afterTest(bool test_for_leaks) {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::PASS), "Pass",
                              TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        }

        if (test_for_leaks) {
            const SizeT remaining_allocations = MemoryRecord::CheckSubMemory();
            MemoryRecord::ResetSubMemory();

            if (remaining_allocations != 0) {
                TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Leak detected",
                                  TestOutPut::GetColor(TestOutPut::Colors::END), ": ", remaining_allocations,
                                  " remaining allocations.\n");
            }
        }
    }